

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O0

QByteArray * __thiscall QZipReader::fileData(QZipReader *this,QString *fileName)

{
  long *plVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  qsizetype qVar10;
  long lVar11;
  int *piVar12;
  FileHeader *pFVar13;
  size_t __nbytes;
  __off_t __length;
  long *in_RSI;
  QZipReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  int res;
  int compression_method;
  uint skip;
  int start;
  int compressed_size;
  ushort general_purpose_bits;
  ushort version_needed;
  int i;
  QByteArray *baunzip;
  ulong len;
  QByteArray compressed;
  int uncompressed_size;
  LocalFileHeader lh;
  FileHeader header;
  FileHeader *in_stack_fffffffffffffd88;
  FileHeader *in_stack_fffffffffffffd90;
  int line;
  ulong *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  QZipReaderPrivate *pQVar14;
  int local_1b4;
  QMessageLogger local_198;
  QMessageLogger local_158;
  int local_134;
  long local_130;
  QByteArray local_128;
  QMessageLogger local_108;
  uint local_e4;
  QMessageLogger local_e0;
  undefined1 *local_a8;
  uchar local_a0 [14];
  undefined8 uStack_92;
  undefined8 local_88;
  undefined1 *puStack_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = in_RDI;
  QZipReaderPrivate::scanFiles(in_RDI);
  for (local_1b4 = 0; qVar10 = QList<FileHeader>::size((QList<FileHeader> *)(*in_RSI + 0x10)),
      local_1b4 < qVar10; local_1b4 = local_1b4 + 1) {
    QList<FileHeader>::at
              ((QList<FileHeader> *)in_stack_fffffffffffffd90,(qsizetype)in_stack_fffffffffffffd88);
    QString::fromLocal8Bit<void>((QByteArray *)in_stack_fffffffffffffd90);
    bVar2 = ::operator==((QString *)in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88);
    QString::~QString((QString *)0x31fa16);
    if (bVar2) break;
  }
  qVar10 = QList<FileHeader>::size((QList<FileHeader> *)(*in_RSI + 0x10));
  if (local_1b4 == qVar10) {
    QByteArray::QByteArray((QByteArray *)0x31fa72);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QList<FileHeader>::at
              ((QList<FileHeader> *)in_stack_fffffffffffffd90,(qsizetype)in_stack_fffffffffffffd88);
    FileHeader::FileHeader(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    uVar3 = readUShort((uchar *)((long)&local_88 + 6));
    if (uVar3 < 0x15) {
      uVar3 = readUShort((uchar *)&puStack_80);
      uVar6 = readUInt((uchar *)((long)&local_78 + 4));
      local_e4 = readUInt((uchar *)&puStack_70);
      uVar7 = readUInt((uchar *)((long)&uStack_60 + 2));
      __nbytes = (size_t)uVar7;
      (**(code **)(**(long **)*in_RSI + 0x88))(*(long **)*in_RSI,(long)(int)uVar7);
      local_a0[8] = 0xaa;
      local_a0[9] = 0xaa;
      local_a0[10] = 0xaa;
      local_a0[0xb] = 0xaa;
      local_a0[0xc] = 0xaa;
      local_a0[0xd] = 0xaa;
      uStack_92 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0[0] = 0xaa;
      local_a0[1] = 0xaa;
      local_a0[2] = 0xaa;
      local_a0[3] = 0xaa;
      local_a0[4] = 0xaa;
      local_a0[5] = 0xaa;
      local_a0[6] = 0xaa;
      local_a0[7] = 0xaa;
      QIODevice::read(*(QIODevice **)*in_RSI,(int)&local_a8,(void *)0x1e,__nbytes);
      uVar4 = readUShort((uchar *)((long)&uStack_92 + 4));
      uVar5 = readUShort((uchar *)((long)&uStack_92 + 6));
      plVar1 = *(long **)*in_RSI;
      lVar11 = (**(code **)(*plVar1 + 0x78))();
      (**(code **)(*plVar1 + 0x88))(plVar1,lVar11 + (ulong)((uint)uVar4 + (uint)uVar5));
      uVar4 = readUShort(local_a0);
      uVar8 = (uint)uVar4;
      if ((uVar3 & 1) == 0) {
        local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QIODevice::read((QIODevice *)&local_128,(int)*(undefined8 *)*in_RSI,(void *)(long)(int)uVar6
                        ,0xaaaaaaaaaaaaaaaa);
        if (uVar8 == 0) {
          QByteArray::truncate(&local_128,(char *)(long)(int)local_e4,__length);
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffd90,(QByteArray *)in_stack_fffffffffffffd88
                    );
        }
        else if (uVar8 == 8) {
          QByteArray::truncate(&local_128,(char *)(long)(int)uVar6,__length);
          (in_RDI->super_QZipPrivate).fileHeaders.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (in_RDI->super_QZipPrivate).device = (QIODevice *)&DAT_aaaaaaaaaaaaaaaa;
          *(undefined1 **)&(in_RDI->super_QZipPrivate).ownDevice = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)0x31fe6c);
          local_134 = 1;
          piVar12 = qMax<int>((int *)&local_e4,&local_134);
          local_130 = (long)*piVar12;
          do {
            QByteArray::resize((QByteArray *)
                               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                               (qsizetype)in_stack_fffffffffffffd98);
            QByteArray::data((QByteArray *)in_stack_fffffffffffffd90);
            QByteArray::constData((QByteArray *)0x31fee0);
            iVar9 = inflate((Bytef *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98,(Bytef *)in_stack_fffffffffffffd90,
                            (ulong)in_stack_fffffffffffffd88);
            in_stack_fffffffffffffd98 = (ulong *)(ulong)(iVar9 + 5);
            line = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
            in_stack_fffffffffffffda4 = iVar9;
            switch(in_stack_fffffffffffffd98) {
            case (ulong *)0x0:
              local_130 = local_130 << 1;
              break;
            case (ulong *)0x1:
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)CONCAT44(iVar9,in_stack_fffffffffffffda0),
                         (char *)in_stack_fffffffffffffd98,line,(char *)in_stack_fffffffffffffd88);
              QMessageLogger::warning(&local_158,"QZip: Z_MEM_ERROR: Not enough memory");
              break;
            case (ulong *)0x2:
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)CONCAT44(iVar9,in_stack_fffffffffffffda0),
                         (char *)in_stack_fffffffffffffd98,line,(char *)in_stack_fffffffffffffd88);
              QMessageLogger::warning
                        ((QMessageLogger *)&stack0xfffffffffffffe88,
                         "QZip: Z_DATA_ERROR: Input data is corrupted");
              break;
            case (ulong *)0x5:
              in_stack_fffffffffffffd90 = (FileHeader *)(long)(int)local_130;
              pFVar13 = (FileHeader *)QByteArray::size((QByteArray *)in_RDI);
              if (in_stack_fffffffffffffd90 != pFVar13) {
                QByteArray::resize((QByteArray *)
                                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                                   (qsizetype)in_stack_fffffffffffffd98);
              }
            }
          } while (iVar9 == -5);
        }
        else {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                     ,(char *)in_stack_fffffffffffffd98,
                     (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                     (char *)in_stack_fffffffffffffd88);
          QMessageLogger::warning
                    (&local_198,
                     "QZip: Unsupported compression method %d is needed to extract the data.",
                     (ulong)uVar8);
          QByteArray::QByteArray((QByteArray *)0x320092);
        }
        QByteArray::~QByteArray((QByteArray *)0x3200aa);
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (char *)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd88);
        QMessageLogger::warning
                  (&local_108,"QZip: Unsupported encryption method is needed to extract the data.");
        QByteArray::QByteArray((QByteArray *)0x31fd67);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (char *)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                 (char *)in_stack_fffffffffffffd88);
      QMessageLogger::warning
                (&local_e0,
                 "QZip: .ZIP specification version %d implementationis needed to extract the data.",
                 (ulong)uVar3);
      QByteArray::QByteArray((QByteArray *)0x31fb62);
    }
    FileHeader::~FileHeader(in_stack_fffffffffffffd90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)pQVar14;
}

Assistant:

QByteArray QZipReader::fileData(const QString &fileName) const
{
    d->scanFiles();
    int i;
    for (i = 0; i < d->fileHeaders.size(); ++i) {
        if (QString::fromLocal8Bit(d->fileHeaders.at(i).file_name) == fileName)
            break;
    }
    if (i == d->fileHeaders.size())
        return QByteArray();

    FileHeader header = d->fileHeaders.at(i);

    ushort version_needed = readUShort(header.h.version_needed);
    if (version_needed > ZIP_VERSION) {
        qWarning("QZip: .ZIP specification version %d implementationis needed to extract the data.", version_needed);
        return QByteArray();
    }

    ushort general_purpose_bits = readUShort(header.h.general_purpose_bits);
    int compressed_size = readUInt(header.h.compressed_size);
    int uncompressed_size = readUInt(header.h.uncompressed_size);
    int start = readUInt(header.h.offset_local_header);
    //qDebug("uncompressing file %d: local header at %d", i, start);

    d->device->seek(start);
    LocalFileHeader lh;
    d->device->read((char *)&lh, sizeof(LocalFileHeader));
    uint skip = readUShort(lh.file_name_length) + readUShort(lh.extra_field_length);
    d->device->seek(d->device->pos() + skip);

    int compression_method = readUShort(lh.compression_method);
    //qDebug("file=%s: compressed_size=%d, uncompressed_size=%d", fileName.toLocal8Bit().data(), compressed_size, uncompressed_size);

    if ((general_purpose_bits & Encrypted) != 0) {
        qWarning("QZip: Unsupported encryption method is needed to extract the data.");
        return QByteArray();
    }

    //qDebug("file at %lld", d->device->pos());
    QByteArray compressed = d->device->read(compressed_size);
    if (compression_method == CompressionMethodStored) {
        // no compression
        compressed.truncate(uncompressed_size);
        return compressed;
    } else if (compression_method == CompressionMethodDeflated) {
        // Deflate
        //qDebug("compressed=%d", compressed.size());
        compressed.truncate(compressed_size);
        QByteArray baunzip;
        ulong len = qMax(uncompressed_size,  1);
        int res;
        do {
            baunzip.resize(len);
            res = inflate((uchar*)baunzip.data(), &len,
                          (const uchar*)compressed.constData(), compressed_size);

            switch (res) {
            case Z_OK:
                if ((int)len != baunzip.size())
                    baunzip.resize(len);
                break;
            case Z_MEM_ERROR:
                qWarning("QZip: Z_MEM_ERROR: Not enough memory");
                break;
            case Z_BUF_ERROR:
                len *= 2;
                break;
            case Z_DATA_ERROR:
                qWarning("QZip: Z_DATA_ERROR: Input data is corrupted");
                break;
            }
        } while (res == Z_BUF_ERROR);
        return baunzip;
    }

    qWarning("QZip: Unsupported compression method %d is needed to extract the data.", compression_method);
    return QByteArray();
}